

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::BasicCopyTexSubImage2DCase::createTexture(BasicCopyTexSubImage2DCase *this)

{
  ContextWrapper *this_00;
  byte bVar1;
  BasicCopyTexSubImage2DCase *pBVar2;
  int iVar3;
  deUint32 dVar4;
  int iVar5;
  int height;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  Context *pCVar9;
  NotSupportedError *this_01;
  bool bVar10;
  int iVar11;
  ChannelOrder CVar12;
  int iVar13;
  deUint32 tex;
  BasicCopyTexSubImage2DCase *local_230;
  deUint32 local_224;
  Vec4 colorA;
  Random rnd;
  PixelBufferAccess local_200;
  TextureLevel data;
  TextureFormat fmt;
  Vector<float,_4> local_1a8;
  Vec4 colorB;
  GradientShader shader;
  long lVar8;
  
  iVar3 = (*((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.m_context)->
            m_renderCtx->_vptr_RenderContext[4])();
  lVar8 = CONCAT44(extraout_var,iVar3);
  bVar10 = false;
  if ((0 < *(int *)(lVar8 + 8)) && (bVar10 = false, 0 < *(int *)(lVar8 + 0xc))) {
    bVar10 = 0 < *(int *)(lVar8 + 0x10);
  }
  iVar3 = *(int *)(lVar8 + 0x14);
  fmt = glu::mapGLTransferFormat
                  (*(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4,this->m_dataType);
  CVar12 = fmt.order;
  bVar1 = (byte)fmt.order;
  tex = 0;
  tcu::TextureLevel::TextureLevel(&data,&fmt);
  local_230 = this;
  dVar4 = deStringHash((this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.
                       super_TestCase.super_TestNode.m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar4);
  FboTestUtil::GradientShader::GradientShader(&shader,TYPE_FLOAT_VEC4);
  this_00 = &(local_230->super_Texture2DSpecCase).super_TextureSpecCase.super_ContextWrapper;
  pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
  dVar4 = (*pCVar9->_vptr_Context[0x75])(pCVar9,&shader);
  if ((CVar12 == A || bVar10) &&
     ((RGBA < CVar12 || (0xedU >> (bVar1 & 0x1f) & 1) != 0) || 0 < iVar3)) {
    sglr::ContextWrapper::glGenTextures(this_00,1,&tex);
    sglr::ContextWrapper::glBindTexture(this_00,0xde1,tex);
    sglr::ContextWrapper::glPixelStorei(this_00,0xcf5,1);
    iVar3 = 0;
    local_224 = dVar4;
    while( true ) {
      pBVar2 = local_230;
      if ((local_230->super_Texture2DSpecCase).m_numLevels <= iVar3) break;
      iVar11 = (local_230->super_Texture2DSpecCase).m_width >> ((byte)iVar3 & 0x1f);
      if (iVar11 < 2) {
        iVar11 = 1;
      }
      iVar13 = (local_230->super_Texture2DSpecCase).m_height >> ((byte)iVar3 & 0x1f);
      if (iVar13 < 2) {
        iVar13 = 1;
      }
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_200,0.0);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&colorB,1.0);
      randomVector<4>((Functional *)&colorA,(Random *)&rnd.m_rnd,(Vector<float,_4> *)&local_200,
                      (Vector<float,_4> *)&colorB);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_200,0.0);
      tcu::Vector<float,_4>::Vector(&local_1a8,1.0);
      randomVector<4>((Functional *)&colorB,(Random *)&rnd.m_rnd,(Vector<float,_4> *)&local_200,
                      &local_1a8);
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      tcu::TextureLevel::setSize(&data,iVar11,iVar13,1);
      tcu::TextureLevel::getAccess(&local_200,&data);
      tcu::fillWithGrid(&local_200,dVar4 % 0xf + 2,&colorA,&colorB);
      iVar5 = *(int *)&(pBVar2->super_Texture2DSpecCase).field_0xd4;
      dVar4 = pBVar2->m_dataType;
      tcu::TextureLevel::getAccess(&local_200,&data);
      sglr::ContextWrapper::glTexImage2D
                (this_00,0xde1,iVar3,iVar5,iVar11,iVar13,0,iVar5,dVar4,
                 local_200.super_ConstPixelBufferAccess.m_data);
      iVar3 = iVar3 + 1;
    }
    pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
    dVar4 = local_224;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&local_200,0.0);
    tcu::Vector<float,_4>::Vector(&colorA,1.0);
    FboTestUtil::GradientShader::setGradient(&shader,pCVar9,dVar4,(Vec4 *)&local_200,&colorA);
    pCVar9 = sglr::ContextWrapper::getCurrentContext(this_00);
    local_200.super_ConstPixelBufferAccess.m_format.order = 0xbf800000;
    local_200.super_ConstPixelBufferAccess.m_format.type = 0xbf800000;
    local_200.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
    colorA.m_data[0] = 1.0;
    colorA.m_data[1] = 1.0;
    colorA.m_data[2] = 0.0;
    sglr::drawQuad(pCVar9,dVar4,(Vec3 *)&local_200,(Vec3 *)&colorA);
    for (iVar3 = 0; iVar3 < (local_230->super_Texture2DSpecCase).m_numLevels; iVar3 = iVar3 + 1) {
      iVar11 = (local_230->super_Texture2DSpecCase).m_width >> ((byte)iVar3 & 0x1f);
      if (iVar11 < 2) {
        iVar11 = 1;
      }
      iVar13 = (local_230->super_Texture2DSpecCase).m_height >> ((byte)iVar3 & 0x1f);
      if (iVar13 < 2) {
        iVar13 = 1;
      }
      iVar5 = de::Random::getInt(&rnd,1,iVar11);
      height = de::Random::getInt(&rnd,1,iVar13);
      iVar11 = de::Random::getInt(&rnd,0,iVar11 - iVar5);
      iVar13 = de::Random::getInt(&rnd,0,iVar13 - height);
      iVar6 = sglr::ContextWrapper::getWidth(this_00);
      iVar6 = de::Random::getInt(&rnd,0,iVar6 - iVar5);
      iVar7 = sglr::ContextWrapper::getHeight(this_00);
      iVar7 = de::Random::getInt(&rnd,0,iVar7 - height);
      sglr::ContextWrapper::glCopyTexSubImage2D
                (this_00,0xde1,iVar3,iVar11,iVar13,iVar6,iVar7,iVar5,height);
    }
    sglr::ShaderProgram::~ShaderProgram(&shader.super_ShaderProgram);
    tcu::TextureLevel::~TextureLevel(&data);
    return;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  tcu::NotSupportedError::NotSupportedError
            (this_01,"Copying from current framebuffer is not supported",
             glcts::fixed_sample_locations_values + 1,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fTextureSpecificationTests.cpp"
             ,0x7c4);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void createTexture (void)
	{
		const tcu::RenderTarget&	renderTarget	= TestCase::m_context.getRenderContext().getRenderTarget();
		bool						targetHasRGB	= renderTarget.getPixelFormat().redBits > 0 && renderTarget.getPixelFormat().greenBits > 0 && renderTarget.getPixelFormat().blueBits > 0;
		bool						targetHasAlpha	= renderTarget.getPixelFormat().alphaBits > 0;
		tcu::TextureFormat			fmt				= glu::mapGLTransferFormat(m_format, m_dataType);
		bool						texHasRGB		= fmt.order != tcu::TextureFormat::A;
		bool						texHasAlpha		= fmt.order == tcu::TextureFormat::RGBA || fmt.order == tcu::TextureFormat::LA || fmt.order == tcu::TextureFormat::A;
		deUint32					tex				= 0;
		tcu::TextureLevel			data			(fmt);
		de::Random					rnd				(deStringHash(getName()));
		GradientShader				shader			(glu::TYPE_FLOAT_VEC4);
		deUint32					shaderID		= getCurrentContext()->createProgram(&shader);

		if ((texHasRGB && !targetHasRGB) || (texHasAlpha && !targetHasAlpha))
			throw tcu::NotSupportedError("Copying from current framebuffer is not supported", "", __FILE__, __LINE__);

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_2D, tex);
		glPixelStorei(GL_UNPACK_ALIGNMENT, 1);

		// First specify full texture.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			Vec4	colorA		= randomVector<4>(rnd);
			Vec4	colorB		= randomVector<4>(rnd);
			int		cellSize	= rnd.getInt(2, 16);

			data.setSize(levelW, levelH);
			tcu::fillWithGrid(data.getAccess(), cellSize, colorA, colorB);

			glTexImage2D(GL_TEXTURE_2D, ndx, m_format, levelW, levelH, 0, m_format, m_dataType, data.getAccess().getDataPtr());
		}

		// Fill render target with gradient.
		shader.setGradient(*getCurrentContext(), shaderID, Vec4(0.0f), Vec4(1.0f));
		sglr::drawQuad(*getCurrentContext(), shaderID, tcu::Vec3(-1.0f, -1.0f, 0.0f), tcu::Vec3(1.0f, 1.0f, 0.0f));

		// Re-specify parts of each level.
		for (int ndx = 0; ndx < m_numLevels; ndx++)
		{
			int		levelW		= de::max(1, m_width >> ndx);
			int		levelH		= de::max(1, m_height >> ndx);

			int		w			= rnd.getInt(1, levelW);
			int		h			= rnd.getInt(1, levelH);
			int		xo			= rnd.getInt(0, levelW-w);
			int		yo			= rnd.getInt(0, levelH-h);

			int		x			= rnd.getInt(0, getWidth() - w);
			int		y			= rnd.getInt(0, getHeight() - h);

			glCopyTexSubImage2D(GL_TEXTURE_2D, ndx, xo, yo, x, y, w, h);
		}
	}